

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

int __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveHyper(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *tol)

{
  type_conflict5 tVar1;
  ulong *puVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar5;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int i_1;
  int i;
  int idx;
  int bestIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leastBest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *fTest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coPen;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffbd0;
  undefined1 local_3f4 [56];
  undefined1 local_3bc [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc58;
  undefined1 local_384 [56];
  uint local_34c;
  undefined4 local_348;
  undefined1 local_344 [56];
  undefined1 local_30c [56];
  undefined1 local_2d4 [56];
  undefined1 local_29c [56];
  undefined1 local_264 [56];
  uint local_22c;
  int local_228;
  int local_224;
  undefined1 local_220 [56];
  ulong local_1e8;
  undefined1 local_1dc [56];
  undefined4 local_1a4;
  undefined1 local_1a0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined8 local_148;
  ulong *local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined4 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  undefined4 *local_40;
  ulong *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<50U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_160 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x3b59a9);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::fTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            **)((in_RDI->m_backend).data._M_elems + 4));
  local_168 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x3b59ca);
  local_1a4 = 0xffffffff;
  local_120 = local_1a0;
  local_128 = &local_1a4;
  local_130 = 0;
  local_40 = local_128;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbd0,(longlong)in_RDI,in_RSI);
  puVar2 = (ulong *)infinity();
  local_1e8 = *puVar2 ^ 0x8000000000000000;
  local_138 = local_1dc;
  local_140 = &local_1e8;
  local_148 = 0;
  local_38 = local_140;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbd0,(double)in_RDI,in_RSI);
  local_118 = local_220;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_224 = -1;
  local_228 = 0;
  local_22c = IdxSet::size((IdxSet *)(in_RDI[5].m_backend.data._M_elems + 8));
  uVar5 = extraout_RDX;
  while (local_22c = local_22c - 1, -1 < (int)local_22c) {
    pcVar3 = IdxSet::index((IdxSet *)(in_RDI[5].m_backend.data._M_elems + 8),
                           (char *)(ulong)local_22c,(int)uVar5);
    local_228 = (int)pcVar3;
    local_50 = local_168 + local_228;
    local_48 = local_220;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_20 = local_264;
    local_28 = in_RSI;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RSI);
    local_10 = local_264;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_8 = local_264;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RSI);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b5c0f);
    if (tVar1) {
      local_108 = local_2d4;
      local_110 = local_220;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_100 = local_160 + local_228;
      local_f8 = local_30c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_e8 = local_344;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_98 = local_220;
      local_a0 = local_29c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b5d32);
      if (tVar1) {
        local_58 = local_1dc;
        local_60 = local_220;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        local_224 = local_228;
      }
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b5d90);
      in_stack_fffffffffffffbbc = CONCAT13(1,(int3)in_stack_fffffffffffffbbc);
      uVar5 = extraout_RDX_00;
      if (!tVar1) {
        local_348 = 0;
        tVar1 = boost::multiprecision::operator<(in_RDI,(int *)in_RSI);
        in_stack_fffffffffffffbbc = CONCAT13(tVar1,(int3)in_stack_fffffffffffffbbc);
        uVar5 = extraout_RDX_01;
      }
      if ((char)((uint)in_stack_fffffffffffffbbc >> 0x18) != '\0') {
        local_68 = local_1a0;
        local_70 = local_220;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        uVar5 = extraout_RDX_02;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(in_RDI[5].m_backend.data._M_elems + 8),(char *)(ulong)local_22c);
      piVar4 = DataArray<int>::operator[]
                         ((DataArray<int> *)
                          (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8),local_228);
      *piVar4 = 0;
      uVar5 = extraout_RDX_03;
    }
  }
  local_34c = IdxSet::size((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcb8));
  uVar5 = extraout_RDX_04;
  while (local_34c = local_34c - 1, -1 < (int)local_34c) {
    pcVar3 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcb8),
                           (char *)(ulong)local_34c,(int)uVar5);
    local_228 = (int)pcVar3;
    piVar4 = DataArray<int>::operator[]
                       ((DataArray<int> *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8)
                        ,local_228);
    uVar5 = extraout_RDX_05;
    if (*piVar4 == 1) {
      local_80 = local_168 + local_228;
      local_78 = local_220;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_d8 = local_3bc;
      local_e0 = local_220;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_d0 = local_160 + local_228;
      local_c8 = local_3f4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_b8 = &stack0xfffffffffffffbd4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_a8 = local_220;
      local_b0 = local_384;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b601d);
      uVar5 = extraout_RDX_06;
      if (tVar1) {
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3b603b);
        if (tVar1) {
          local_88 = local_1dc;
          local_90 = local_220;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                            CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
          local_224 = local_228;
        }
        piVar4 = DataArray<int>::operator[]
                           ((DataArray<int> *)
                            (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8),local_228);
        *piVar4 = 2;
        DIdxSet::addIdx((DIdxSet *)in_RSI,in_stack_fffffffffffffbbc);
        uVar5 = extraout_RDX_07;
      }
    }
  }
  return local_224;
}

Assistant:

int SPxSteepPR<R>::selectLeaveHyper(R tol)
{
   const R* coPen = this->thesolver->coWeights.get_const_ptr();
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   R leastBest = -1;
   R best = R(-infinity);
   R x;
   int bestIdx = -1;
   int idx = 0;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         x = steeppr::computePrice(x, coPen[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bestIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // is this index a candidate for bestPrices?
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -tol);
         x = steeppr::computePrice(x, coPen[idx], tol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bestIdx = idx;
            }

            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bestIdx;
}